

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_andnot(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  rle16_t rVar2;
  rle16_t rVar3;
  rle16_t rVar4;
  int iVar5;
  uint16_t uVar6;
  uint local_38;
  uint local_34;
  int32_t end2;
  int32_t start2;
  int32_t end;
  int32_t start;
  int rlepos2;
  int rlepos1;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  if (dst->capacity < src_1->n_runs + src_2->n_runs) {
    run_container_grow(dst,src_1->n_runs + src_2->n_runs,false);
  }
  dst->n_runs = 0;
  start = 0;
  end = 0;
  start2 = (int32_t)src_1->runs->value;
  end2 = start2 + (uint)src_1->runs->length + 1;
  local_34 = (uint)src_2->runs->value;
  local_38 = local_34 + src_2->runs->length + 1;
  while( true ) {
    bVar1 = false;
    if (start < src_1->n_runs) {
      bVar1 = end < src_2->n_runs;
    }
    uVar6 = (uint16_t)start2;
    if (!bVar1) break;
    if (local_34 < (uint)end2) {
      if ((uint)start2 < local_38) {
        if ((uint)start2 < local_34) {
          iVar5 = dst->n_runs;
          dst->n_runs = iVar5 + 1;
          rVar3.length = ((short)local_34 - uVar6) - 1;
          rVar3.value = uVar6;
          dst->runs[iVar5] = rVar3;
        }
        if (local_38 < (uint)end2) {
          start2 = local_38;
        }
        else {
          start = start + 1;
          if (start < src_1->n_runs) {
            start2 = (int32_t)src_1->runs[start].value;
            end2 = start2 + (uint)src_1->runs[start].length + 1;
          }
        }
      }
      else {
        end = end + 1;
        if (end < src_2->n_runs) {
          local_34 = (uint)src_2->runs[end].value;
          local_38 = local_34 + src_2->runs[end].length + 1;
        }
      }
    }
    else {
      iVar5 = dst->n_runs;
      dst->n_runs = iVar5 + 1;
      rVar2.length = ((short)end2 - uVar6) - 1;
      rVar2.value = uVar6;
      dst->runs[iVar5] = rVar2;
      start = start + 1;
      if (start < src_1->n_runs) {
        start2 = (int32_t)src_1->runs[start].value;
        end2 = start2 + (uint)src_1->runs[start].length + 1;
      }
    }
  }
  if (start < src_1->n_runs) {
    iVar5 = dst->n_runs;
    dst->n_runs = iVar5 + 1;
    rVar4.length = ((short)end2 - uVar6) - 1;
    rVar4.value = uVar6;
    dst->runs[iVar5] = rVar4;
    iVar5 = start + 1;
    if (iVar5 < src_1->n_runs) {
      memcpy(dst->runs + dst->n_runs,src_1->runs + iVar5,(long)(src_1->n_runs - iVar5) << 2);
      dst->n_runs = (src_1->n_runs - iVar5) + dst->n_runs;
    }
  }
  return;
}

Assistant:

void run_container_andnot(const run_container_t *src_1,
                          const run_container_t *src_2, run_container_t *dst) {
    // following Java implementation as of June 2016

    if (dst->capacity < src_1->n_runs + src_2->n_runs)
        run_container_grow(dst, src_1->n_runs + src_2->n_runs, false);

    dst->n_runs = 0;

    int rlepos1 = 0;
    int rlepos2 = 0;
    int32_t start = src_1->runs[rlepos1].value;
    int32_t end = start + src_1->runs[rlepos1].length + 1;
    int32_t start2 = src_2->runs[rlepos2].value;
    int32_t end2 = start2 + src_2->runs[rlepos2].length + 1;

    while ((rlepos1 < src_1->n_runs) && (rlepos2 < src_2->n_runs)) {
        if (end <= start2) {
            // output the first run
            dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos1++;
            if (rlepos1 < src_1->n_runs) {
                start = src_1->runs[rlepos1].value;
                end = start + src_1->runs[rlepos1].length + 1;
            }
        } else if (end2 <= start) {
            // exit the second run
            rlepos2++;
            if (rlepos2 < src_2->n_runs) {
                start2 = src_2->runs[rlepos2].value;
                end2 = start2 + src_2->runs[rlepos2].length + 1;
            }
        } else {
            if (start < start2) {
                dst->runs[dst->n_runs++] =
                    MAKE_RLE16(start, start2 - start - 1);
            }
            if (end2 < end) {
                start = end2;
            } else {
                rlepos1++;
                if (rlepos1 < src_1->n_runs) {
                    start = src_1->runs[rlepos1].value;
                    end = start + src_1->runs[rlepos1].length + 1;
                }
            }
        }
    }
    if (rlepos1 < src_1->n_runs) {
        dst->runs[dst->n_runs++] = MAKE_RLE16(start, end - start - 1);
        rlepos1++;
        if (rlepos1 < src_1->n_runs) {
            memcpy(dst->runs + dst->n_runs, src_1->runs + rlepos1,
                   sizeof(rle16_t) * (src_1->n_runs - rlepos1));
            dst->n_runs += src_1->n_runs - rlepos1;
        }
    }
}